

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::SupportVectorRegressor::SupportVectorRegressor
          (SupportVectorRegressor *this,SupportVectorRegressor *from)

{
  void *pvVar1;
  Kernel *from_00;
  Coefficients *from_01;
  Kernel *this_00;
  Coefficients *this_01;
  SparseSupportVectors *this_02;
  DenseSupportVectors *this_03;
  SparseSupportVectors *from_02;
  DenseSupportVectors *from_03;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SupportVectorRegressor_0072c040;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  from_00 = from->kernel_;
  if (from_00 == (Kernel *)0x0 ||
      from == (SupportVectorRegressor *)&_SupportVectorRegressor_default_instance_) {
    this_00 = (Kernel *)0x0;
  }
  else {
    this_00 = (Kernel *)operator_new(0x20);
    Kernel::Kernel(this_00,from_00);
  }
  this->kernel_ = this_00;
  from_01 = from->coefficients_;
  if (from_01 == (Coefficients *)0x0 ||
      from == (SupportVectorRegressor *)&_SupportVectorRegressor_default_instance_) {
    this_01 = (Coefficients *)0x0;
  }
  else {
    this_01 = (Coefficients *)operator_new(0x28);
    Coefficients::Coefficients(this_01,from_01);
  }
  this->coefficients_ = this_01;
  this->rho_ = from->rho_;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 3) {
    clear_supportVectors(this);
    this->_oneof_case_[0] = 3;
    this_03 = (DenseSupportVectors *)operator_new(0x30);
    DenseSupportVectors::DenseSupportVectors(this_03);
    (this->supportVectors_).densesupportvectors_ = this_03;
    if (from->_oneof_case_[0] == 3) {
      from_03 = (from->supportVectors_).densesupportvectors_;
    }
    else {
      protobuf_SVM_2eproto::InitDefaults();
      from_03 = (DenseSupportVectors *)&_DenseSupportVectors_default_instance_;
    }
    DenseSupportVectors::MergeFrom(this_03,from_03);
  }
  else if (from->_oneof_case_[0] == 2) {
    clear_supportVectors(this);
    this->_oneof_case_[0] = 2;
    this_02 = (SparseSupportVectors *)operator_new(0x30);
    SparseSupportVectors::SparseSupportVectors(this_02);
    (this->supportVectors_).sparsesupportvectors_ = this_02;
    if (from->_oneof_case_[0] == 2) {
      from_02 = (from->supportVectors_).sparsesupportvectors_;
    }
    else {
      protobuf_SVM_2eproto::InitDefaults();
      from_02 = (SparseSupportVectors *)&_SparseSupportVectors_default_instance_;
    }
    SparseSupportVectors::MergeFrom(this_02,from_02);
  }
  return;
}

Assistant:

SupportVectorRegressor::SupportVectorRegressor(const SupportVectorRegressor& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_kernel()) {
    kernel_ = new ::CoreML::Specification::Kernel(*from.kernel_);
  } else {
    kernel_ = NULL;
  }
  if (from.has_coefficients()) {
    coefficients_ = new ::CoreML::Specification::Coefficients(*from.coefficients_);
  } else {
    coefficients_ = NULL;
  }
  rho_ = from.rho_;
  clear_has_supportVectors();
  switch (from.supportVectors_case()) {
    case kSparseSupportVectors: {
      mutable_sparsesupportvectors()->::CoreML::Specification::SparseSupportVectors::MergeFrom(from.sparsesupportvectors());
      break;
    }
    case kDenseSupportVectors: {
      mutable_densesupportvectors()->::CoreML::Specification::DenseSupportVectors::MergeFrom(from.densesupportvectors());
      break;
    }
    case SUPPORTVECTORS_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.SupportVectorRegressor)
}